

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O0

void __thiscall Gym_Emu::parse_frame(Gym_Emu *this)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  Music_Emu *in_RDI;
  Gym_Emu *unaff_retaddr;
  int data2;
  int data;
  int cmd;
  byte_ *pos;
  int dac_count;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_fffffffffffffff0;
  int iVar6;
  Music_Emu *pMVar7;
  
  iVar6 = 0;
  pbVar5 = (byte *)in_RDI[3].super_Gme_File.playlist.data.begin_;
  pMVar7 = in_RDI;
  if ((in_RDI[3].super_Gme_File.playlist.first_error_ != 0) &&
     (iVar2 = in_RDI[3].super_Gme_File.playlist.first_error_ + -1,
     in_RDI[3].super_Gme_File.playlist.first_error_ = iVar2, iVar2 == 0)) {
    in_RDI[3].super_Gme_File.playlist.entries.size_ = (size_t)pbVar5;
  }
  while( true ) {
    iVar2 = (int)((ulong)pMVar7 >> 0x20);
    pbVar3 = pbVar5 + 1;
    bVar1 = *pbVar5;
    if (bVar1 == 0) break;
    pbVar4 = pbVar5 + 2;
    if (bVar1 == 1) {
      pbVar5 = pbVar5 + 3;
      if (*pbVar3 == 0x2a) {
        if (iVar6 < 0x400) {
          *(byte *)((long)&in_RDI[9].buf_remain + (long)iVar6) = *pbVar4;
          iVar6 = (uint)(*(byte *)((long)&in_RDI[4].super_Gme_File.playlist.info_.ripping + 4) & 1)
                  + iVar6;
        }
      }
      else {
        if (*pbVar3 == 0x2b) {
          *(bool *)((long)&in_RDI[4].super_Gme_File.playlist.info_.ripping + 4) =
               (*pbVar4 & 0x80) != 0;
        }
        Ym2612_Emu::write0((Ym2612_Emu *)in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
        ;
      }
    }
    else if (bVar1 == 2) {
      pbVar5 = pbVar5 + 3;
      Ym2612_Emu::write1((Ym2612_Emu *)in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    }
    else if (bVar1 == 3) {
      Sms_Apu::write_data((Sms_Apu *)CONCAT44(iVar6,in_stack_fffffffffffffff0),
                          (blip_time_t)((ulong)pbVar4 >> 0x20),(int)pbVar4);
      pbVar5 = pbVar4;
    }
    else {
      pbVar5 = pbVar5 + 1;
    }
  }
  if ((byte *)in_RDI[3].super_Gme_File.playlist.data.size_ <= pbVar3) {
    if (in_RDI[3].super_Gme_File.playlist.entries.size_ == 0) {
      Music_Emu::set_track_ended(in_RDI);
    }
    else {
      pbVar3 = (byte *)in_RDI[3].super_Gme_File.playlist.entries.size_;
    }
  }
  in_RDI[3].super_Gme_File.playlist.data.begin_ = (char *)pbVar3;
  if ((iVar6 != 0) &&
     (((ulong)in_RDI[4].super_Gme_File.playlist.info_.ripping & 0x10000000000) == 0)) {
    run_dac(unaff_retaddr,iVar2);
  }
  *(int *)&in_RDI[4].super_Gme_File.playlist.info_.ripping = iVar6;
  return;
}

Assistant:

void Gym_Emu::parse_frame()
{
	int dac_count = 0;
	const byte* pos = this->pos;
	
	if ( loop_remain && !--loop_remain )
		loop_begin = pos; // find loop on first time through sequence
	
	int cmd;
	while ( (cmd = *pos++) != 0 )
	{
		int data = *pos++;
		if ( cmd == 1 )
		{
			int data2 = *pos++;
			if ( data != 0x2A )
			{
				if ( data == 0x2B )
					dac_enabled = (data2 & 0x80) != 0;
				
				fm.write0( data, data2 );
			}
			else if ( dac_count < (int) sizeof dac_buf )
			{
				dac_buf [dac_count] = data2;
				dac_count += dac_enabled;
			}
		}
		else if ( cmd == 2 )
		{
			fm.write1( data, *pos++ );
		}
		else if ( cmd == 3 )
		{
			apu.write_data( 0, data );
		}
		else
		{
			// to do: many GYM streams are full of errors, and error count should
			// reflect cases where music is really having problems
			//log_error(); 
			--pos; // put data back
		}
	}
	
	// loop
	if ( pos >= data_end )
	{
		check( pos == data_end );
		
		if ( loop_begin )
			pos = loop_begin;
		else
			set_track_ended();
	}
	this->pos = pos;
	
	// dac
	if ( dac_count && !dac_muted )
		run_dac( dac_count );
	prev_dac_count = dac_count;
}